

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

compare_lt_result_container<QList<int>,_int> __thiscall
QList<int>::operator<(QList<int> *this,QList<int> *other)

{
  ulong uVar1;
  int *piVar2;
  ulong uVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  
  uVar1 = (this->d).size;
  piVar2 = (other->d).ptr;
  uVar3 = (other->d).size;
  if ((long)uVar3 < (long)uVar1) {
    uVar1 = uVar3;
  }
  piVar5 = piVar2;
  if ((uVar1 & 0x3fffffffffffffff) != 0) {
    piVar6 = (this->d).ptr;
    piVar4 = piVar6 + uVar1;
    do {
      if (*piVar5 != *piVar6) {
        return *piVar6 < *piVar5;
      }
      piVar6 = piVar6 + 1;
      piVar5 = piVar5 + 1;
    } while (piVar6 != piVar4);
  }
  return piVar5 != piVar2 + uVar3;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }